

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::ImplMaxDrawBuffersIndexedTest::iterate
          (ImplMaxDrawBuffersIndexedTest *this)

{
  undefined8 log_00;
  deUint32 err;
  deBool dVar1;
  TestLog *log_01;
  RenderContext *pRVar2;
  deUint32 extraout_var;
  TestError *this_00;
  undefined1 local_1a8 [8];
  vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  drawBuffers;
  BlendState postCommonBlendState;
  BlendState preCommonBlendState;
  undefined1 local_b8 [4];
  deInt32 maxDrawBuffers;
  Random rng;
  Functions *gl;
  allocator<char> local_89;
  string local_88;
  undefined1 local_68 [8];
  ResultCollector results;
  TestLog *log;
  ImplMaxDrawBuffersIndexedTest *this_local;
  
  log_01 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  results.m_message.field_2._8_8_ = log_01;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"",&local_89);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_68,log_01,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  pRVar2 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  rng.m_rnd.z = (*pRVar2->_vptr_RenderContext[3])();
  rng.m_rnd.w = extraout_var;
  de::Random::Random((Random *)local_b8,this->m_seed);
  preCommonBlendState.colorMask.field_1.m_align._4_4_ = 0;
  BlendState::BlendState((BlendState *)&postCommonBlendState.colorMask.field_1);
  BlendState::BlendState
            ((BlendState *)
             &drawBuffers.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  ::vector((vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
            *)local_1a8);
  (**(code **)(rng.m_rnd._8_8_ + 0x868))
            (0x8824,(undefined1 *)((long)&preCommonBlendState.colorMask.field_1 + 4));
  err = (**(code **)(rng.m_rnd._8_8_ + 0x800))();
  glu::checkError(err,"glGetIntegerv(GL_MAX_DRAW_BUFFERS) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawBuffersIndexedTests.cpp"
                  ,0x5c2);
  while( true ) {
    dVar1 = ::deGetFalse();
    if ((dVar1 != 0) || ((int)preCommonBlendState.colorMask.field_1.m_align._4_4_ < 1)) break;
    dVar1 = ::deGetFalse();
    if (dVar1 == 0) {
      genRandomTest((Random *)local_b8,(BlendState *)&postCommonBlendState.colorMask.field_1,
                    (BlendState *)
                    &drawBuffers.
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                     *)local_1a8,preCommonBlendState.colorMask.field_1.m_align._4_4_,
                    (this->super_TestCase).m_context);
      log_00 = results.m_message.field_2._8_8_;
      pRVar2 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
      anon_unknown_0::runTest
                ((TestLog *)log_00,(ResultCollector *)local_68,pRVar2,
                 (BlendState *)&postCommonBlendState.colorMask.field_1,
                 (BlendState *)
                 &drawBuffers.
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                  *)local_1a8);
      tcu::ResultCollector::setTestContextResult
                ((ResultCollector *)local_68,
                 (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
      ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                 *)local_1a8);
      BlendState::~BlendState
                ((BlendState *)
                 &drawBuffers.
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      BlendState::~BlendState((BlendState *)&postCommonBlendState.colorMask.field_1);
      de::Random::~Random((Random *)local_b8);
      tcu::ResultCollector::~ResultCollector((ResultCollector *)local_68);
      return STOP;
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"maxDrawBuffers > 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawBuffersIndexedTests.cpp"
             ,0x5c4);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

TestCase::IterateResult ImplMaxDrawBuffersIndexedTest::iterate (void)
{
	TestLog&				log						= m_testCtx.getLog();
	tcu::ResultCollector	results					(log);
	const glw::Functions&	gl						= m_context.getRenderContext().getFunctions();
	de::Random				rng						(m_seed);
	deInt32					maxDrawBuffers			= 0;
	BlendState				preCommonBlendState;
	BlendState				postCommonBlendState;
	vector<DrawBufferInfo>	drawBuffers;

	gl.getIntegerv(GL_MAX_DRAW_BUFFERS, &maxDrawBuffers);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv(GL_MAX_DRAW_BUFFERS) failed");

	TCU_CHECK(maxDrawBuffers > 0);

	genRandomTest(rng, preCommonBlendState, postCommonBlendState, drawBuffers, maxDrawBuffers, m_context);

	runTest(log, results, m_context.getRenderContext(), preCommonBlendState, postCommonBlendState, drawBuffers);

	results.setTestContextResult(m_testCtx);

	return STOP;
}